

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

int HorseTrap(Situation *s)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  int i;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int horse_traps_value [2];
  int local_48 [2];
  long local_40;
  long local_38;
  
  lVar3 = 0;
  do {
    local_38 = lVar3 * 0x10 + 0x10;
    local_48[lVar3] = 0;
    local_40 = lVar3;
    lVar4 = 5;
    do {
      bVar1 = s->current_pieces[local_38 + lVar4];
      if ((ulong)bVar1 != 0) {
        iVar5 = HORSE_CAN_GET[bVar1][0];
        if (iVar5 == 0) {
          iVar6 = 0;
        }
        else {
          lVar7 = (ulong)bVar1 * 0x28;
          iVar6 = 0;
          do {
            if ((((EDGE_SQUARES[iVar5] == false) && (s->current_board[iVar5] == '\0')) &&
                (s->current_board[*(int *)((long)HORSE_LEG[0] + lVar7)] == '\0')) &&
               ((bVar2 = IfProtected(1 - (int)lVar3,iVar5,s,0), !bVar2 &&
                (bVar2 = iVar6 != 0, iVar6 = 1, bVar2)))) {
              iVar6 = 2;
              break;
            }
            iVar5 = *(int *)((long)HORSE_CAN_GET[0] + lVar7 + 4);
            lVar7 = lVar7 + 4;
          } while (iVar5 != 0);
        }
        if (iVar6 == 0) {
          iVar5 = 10;
        }
        else {
          if (iVar6 != 1) goto LAB_0010d378;
          iVar5 = 5;
        }
        local_48[local_40] = local_48[local_40] + iVar5;
      }
LAB_0010d378:
      lVar4 = lVar4 + 1;
    } while (lVar4 != 7);
    lVar3 = local_40 + 1;
    if (local_40 != 0) {
      iVar5 = -(local_48[1] - local_48[0]);
      if (s->current_player == 0) {
        iVar5 = local_48[1] - local_48[0];
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

int HorseTrap(Situation &s)
{
    int side_tag;
    int moveble;
    int horse_traps_value[2];
    int *horse_dst, *horse_leg;
    int dst;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        horse_traps_value[r] = 0;
        // 考虑马可以走的位置，走到棋盘边缘上，或者走到对方的控制格，都必须排除
        for (int i = 5; i <= 6; i++)
        {
            int pos = s.current_pieces[side_tag + i];
            if (pos != 0)
            {
                moveble = 0;
                horse_dst = HORSE_CAN_GET[pos];
                horse_leg = HORSE_LEG[pos];
                dst = *horse_dst;
                while (dst)
                {
                    if (!EDGE_SQUARES[dst] && !s.current_board[dst] && !s.current_board[*horse_leg] && !IfProtected(1 - r, dst, s))
                    {
                        moveble++;
                        if (moveble > 1)
                            break;
                    }
                    horse_dst++;
                    dst = *horse_dst;
                    horse_leg++;
                }
                // 没有好的着法的马给予10分罚分，只有一个好的着法的马给予5分罚分
                if (!moveble)
                    horse_traps_value[r] += 10;
                else if (moveble == 1)
                    horse_traps_value[r] += 5;
            }
        }
    }
    return SideValue(s.current_player, horse_traps_value[1] - horse_traps_value[0]);
}